

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O1

int lj_gc_step(lua_State *L)

{
  undefined4 uVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  
  uVar4 = (ulong)(L->glref).ptr32;
  uVar1 = *(undefined4 *)(uVar4 + 0xe8);
  *(undefined4 *)(uVar4 + 0xe8) = 0xfffffffd;
  iVar2 = *(int *)(uVar4 + 0x48) * 10;
  iVar5 = 0x7fffff00;
  if (iVar2 != 0) {
    iVar5 = iVar2;
  }
  iVar2 = *(uint *)(uVar4 + 0x20) - *(uint *)(uVar4 + 0x24);
  if (*(uint *)(uVar4 + 0x24) <= *(uint *)(uVar4 + 0x20) && iVar2 != 0) {
    *(int *)(uVar4 + 0x4c) = *(int *)(uVar4 + 0x4c) + iVar2;
  }
  do {
    sVar3 = gc_onestep(L);
    if (*(char *)(uVar4 + 0x29) == '\0') {
      iVar2 = (*(uint *)(uVar4 + 0x50) / 100) * *(int *)(uVar4 + 0x54);
      iVar5 = 1;
      goto LAB_001099d7;
    }
    iVar5 = iVar5 - (int)sVar3;
  } while (0 < iVar5);
  if (*(uint *)(uVar4 + 0x4c) < 0x400) {
    iVar2 = *(int *)(uVar4 + 0x20) + 0x400;
    iVar5 = -1;
  }
  else {
    *(uint *)(uVar4 + 0x4c) = *(uint *)(uVar4 + 0x4c) - 0x400;
    iVar2 = *(int *)(uVar4 + 0x20);
    iVar5 = 0;
  }
LAB_001099d7:
  *(int *)(uVar4 + 0x24) = iVar2;
  *(undefined4 *)(uVar4 + 0xe8) = uVar1;
  return iVar5;
}

Assistant:

int LJ_FASTCALL lj_gc_step(lua_State *L)
{
  global_State *g = G(L);
  MSize lim;
  int32_t ostate = g->vmstate;
  setvmstate(g, GC);
  lim = (GCSTEPSIZE/100) * g->gc.stepmul;
  if (lim == 0)
    lim = LJ_MAX_MEM;
  if (g->gc.total > g->gc.threshold)
    g->gc.debt += g->gc.total - g->gc.threshold;
  do {
    lim -= (MSize)gc_onestep(L);
    if (g->gc.state == GCSpause) {
      g->gc.threshold = (g->gc.estimate/100) * g->gc.pause;
      g->vmstate = ostate;
      return 1;  /* Finished a GC cycle. */
    }
  } while ((int32_t)lim > 0);
  if (g->gc.debt < GCSTEPSIZE) {
    g->gc.threshold = g->gc.total + GCSTEPSIZE;
    g->vmstate = ostate;
    return -1;
  } else {
    g->gc.debt -= GCSTEPSIZE;
    g->gc.threshold = g->gc.total;
    g->vmstate = ostate;
    return 0;
  }
}